

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::delete_global_var(CVmObjTable *this,vm_globalvar_t *var)

{
  CVmObjTable *pCVar1;
  
  pCVar1 = (CVmObjTable *)var->prv;
  if (var->nxt != (vm_globalvar_t *)0x0) {
    var->nxt->prv = (vm_globalvar_t *)pCVar1;
  }
  if (pCVar1 != (CVmObjTable *)0x0) {
    this = pCVar1;
  }
  this->global_var_head_ = var->nxt;
  operator_delete(var,0x20);
  return;
}

Assistant:

void CVmObjTable::delete_global_var(vm_globalvar_t *var)
{
    /* unlink it from the list of globals */
    if (var->nxt != 0)
        var->nxt->prv = var->prv;

    if (var->prv != 0)
        var->prv->nxt = var->nxt;
    else
        global_var_head_ = var->nxt;

    /* delete the memory */
    delete var;
}